

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raplcap-msr-common.c
# Opt level: O3

void msr_get_limits(raplcap_msr_ctx *ctx,raplcap_zone zone,uint64_t msrval,raplcap_limit *limit_long
                   ,raplcap_limit *limit_short)

{
  sbyte sVar1;
  undefined4 uVar2;
  sbyte sVar3;
  double dVar4;
  
  if (ctx != (raplcap_msr_ctx *)0x0) {
    uVar2 = 0x7fff;
    sVar1 = 0x31;
    sVar3 = 0x11;
    if ((zone == RAPLCAP_ZONE_PSYS) && ((ctx->cpu_model | 0x40) == 0xcf)) {
      uVar2 = 0x1ffff;
      sVar1 = 0x33;
      sVar3 = 0x13;
    }
    if (limit_long != (raplcap_limit *)0x0) {
      dVar4 = (*ctx->cfg[zone].from_msr_pl)((ulong)uVar2 & (ulong)msrval,ctx->power_units);
      limit_long->watts = dVar4;
      dVar4 = (*ctx->cfg[zone].from_msr_tw)((ulong)(msrval >> sVar3) & 0x7f,ctx->time_units);
      limit_long->seconds = dVar4;
    }
    if (limit_short != (raplcap_limit *)0x0) {
      if (1 < ctx->cfg[zone].constraints) {
        dVar4 = (*ctx->cfg[zone].from_msr_pl)
                          ((ulong)(msrval >> 0x20) & (ulong)uVar2,ctx->power_units);
        limit_short->watts = dVar4;
        dVar4 = (*ctx->cfg[zone].from_msr_tw)((ulong)(msrval >> sVar1) & 0x7f,ctx->time_units);
        limit_short->seconds = dVar4;
      }
    }
    return;
  }
  __assert_fail("ctx != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/powercap[P]raplcap/msr/raplcap-msr-common.c"
                ,0x287,
                "void msr_get_limits(const raplcap_msr_ctx *, raplcap_zone, uint64_t, raplcap_limit *, raplcap_limit *)"
               );
}

Assistant:

void msr_get_limits(const raplcap_msr_ctx* ctx, raplcap_zone zone, uint64_t msrval,
                    raplcap_limit* limit_long, raplcap_limit* limit_short) {
  assert(ctx != NULL);
  uint8_t tw1_shift = TL1_SHIFT;
  uint8_t tw2_shift = TL2_SHIFT;
  uint64_t pl_mask = PL_MASK;
  zone_limits_quirks(ctx, zone, NULL, &tw1_shift, NULL, NULL, &tw2_shift, NULL, &pl_mask);
  if (limit_long != NULL) {
    limit_long->watts = ctx->cfg[zone].from_msr_pl((msrval >> PL1_SHIFT) & pl_mask, ctx->power_units);
    limit_long->seconds = ctx->cfg[zone].from_msr_tw((msrval >> tw1_shift) & TL_MASK, ctx->time_units);
    raplcap_log(DEBUG, "msr_get_limits: zone=%d, long_term:\n\ttime=%.12f s\n\tpower=%.12f W\n",
                zone, limit_long->seconds, limit_long->watts);
  }
  if (limit_short != NULL && HAS_SHORT_TERM(ctx, zone)) {
    limit_short->watts = ctx->cfg[zone].from_msr_pl((msrval >> PL2_SHIFT) & pl_mask, ctx->power_units);
    if (zone == RAPLCAP_ZONE_PSYS) {
      raplcap_log(DEBUG, "msr_get_limits: Documentation does not specify PSys/Platform short term time window\n");
    }
    limit_short->seconds = ctx->cfg[zone].from_msr_tw((msrval >> tw2_shift) & TL_MASK, ctx->time_units);
    raplcap_log(DEBUG, "msr_get_limits: zone=%d, short_term:\n\ttime=%.12f s\n\tpower=%.12f W\n",
                zone, limit_short->seconds, limit_short->watts);
  }
}